

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blif_parser.cpp
# Opt level: O1

void __thiscall Blif::pushAllNodes(Blif *this,string *s)

{
  __normal_iterator<Node_*,_std::vector<Node,_std::allocator<Node>_>_> __last;
  pointer pcVar1;
  Node *pNVar2;
  __normal_iterator<Node_*,_std::vector<Node,_std::allocator<Node>_>_> _Var3;
  string local_118;
  long *local_f8 [2];
  long local_e8 [2];
  Node local_d8;
  
  _Var3._M_current =
       (this->_allNodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (this->_allNodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
       super__Vector_impl_data._M_finish;
  pcVar1 = (s->_M_dataplus)._M_p;
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char*>((string *)local_f8,pcVar1,pcVar1 + s->_M_string_length);
  _Var3 = std::
          find_if<__gnu_cxx::__normal_iterator<Node*,std::vector<Node,std::allocator<Node>>>,Blif::pushAllNodes(std::__cxx11::string)::_lambda(Node&)_1_>
                    (_Var3,__last,(anon_class_32_1_54a39813_for__M_pred *)local_f8);
  pNVar2 = (this->_allNodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_f8[0] != local_e8) {
    operator_delete(local_f8[0],local_e8[0] + 1);
  }
  if (_Var3._M_current == pNVar2) {
    pcVar1 = (s->_M_dataplus)._M_p;
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_118,pcVar1,pcVar1 + s->_M_string_length);
    Node::Node(&local_d8,&local_118,false);
    std::vector<Node,_std::allocator<Node>_>::emplace_back<Node>(&this->_allNodes,&local_d8);
    if (local_d8._joinFunction.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_d8._joinFunction.super__Function_base._M_manager)
                ((_Any_data *)&local_d8._joinFunction,(_Any_data *)&local_d8._joinFunction,
                 __destroy_functor);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_d8._successor._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_d8._prodecessor._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._node._M_dataplus._M_p != &local_d8._node.field_2) {
      operator_delete(local_d8._node._M_dataplus._M_p,
                      local_d8._node.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void pushAllNodes(string s) {
    if (find_if(begin(this->_allNodes), end(this->_allNodes), [=] (Node& n) { return n.node() == s; }) == end(this->_allNodes)) {
      this->_allNodes.push_back(Node(s, false)); // all nodes stores only relation information, negate can be ignored
    }
  }